

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_fbs.cpp
# Opt level: O3

vector<unsigned_short,_std::allocator<unsigned_short>_> *
flatbuffers::anon_unknown_0::ExtractProtobufIds
          (vector<unsigned_short,_std::allocator<unsigned_short>_> *__return_storage_ptr__,
          vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *fields)

{
  byte bVar1;
  pointer ppFVar2;
  FieldDef *pFVar3;
  byte *__nptr;
  iterator __position;
  undefined8 in_RAX;
  const_iterator cVar4;
  byte *pbVar5;
  _Base_ptr p_Var6;
  _Base_ptr extraout_RAX;
  int __base;
  pointer ppFVar7;
  voffset_t proto_id;
  unsigned_short local_3a;
  byte *local_38;
  
  cVar4._M_node =
       (_Base_ptr)
       CONCAT71((int7)((ulong)in_RAX >> 8),
                (anonymous_namespace)::
                ExtractProtobufIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                ::ID_abi_cxx11_);
  if (((anonymous_namespace)::
       ExtractProtobufIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
       ::ID_abi_cxx11_ == '\0') &&
     (cVar4._M_node =
           (_Base_ptr)
           __cxa_guard_acquire(&(anonymous_namespace)::
                                ExtractProtobufIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                                ::ID_abi_cxx11_), (int)cVar4._M_node != 0)) {
    (anonymous_namespace)::
    ExtractProtobufIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
    ::ID_abi_cxx11_._M_dataplus._M_p =
         (pointer)&(anonymous_namespace)::
                   ExtractProtobufIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                   ::ID_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &(anonymous_namespace)::
                ExtractProtobufIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                ::ID_abi_cxx11_,"id","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &(anonymous_namespace)::
                  ExtractProtobufIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                  ::ID_abi_cxx11_,&__dso_handle);
    cVar4._M_node =
         (_Base_ptr)
         __cxa_guard_release(&(anonymous_namespace)::
                              ExtractProtobufIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                              ::ID_abi_cxx11_);
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppFVar7 = (fields->
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppFVar2 = (fields->
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppFVar7 == ppFVar2) {
      return (vector<unsigned_short,_std::allocator<unsigned_short>_> *)cVar4._M_node;
    }
    pFVar3 = *ppFVar7;
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                    *)&(pFVar3->super_Definition).attributes,
                   &(anonymous_namespace)::
                    ExtractProtobufIds(std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>const&)
                    ::ID_abi_cxx11_);
    if ((((_Rb_tree_header *)cVar4._M_node !=
          &(pFVar3->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) &&
        (cVar4._M_node = cVar4._M_node[2], cVar4._M_node != (_Base_ptr)0x0)) &&
       (cVar4._M_node[1]._M_parent != (_Base_ptr)0x0)) {
      local_3a = 0;
      __nptr = *(byte **)(cVar4._M_node + 1);
      if (__nptr == (byte *)0x0) {
        __assert_fail("s && val",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/util.h"
                      ,0x14b,
                      "bool flatbuffers::StringToNumber(const char *, T *) [T = unsigned short]");
      }
      bVar1 = *__nptr;
      pbVar5 = __nptr;
      while (bVar1 != 0) {
        pbVar5 = pbVar5 + 1;
        if ((int)(char)bVar1 - 0x30U < 10) {
          if ((bVar1 == 0x30) && ((*pbVar5 & 0xdf) == 0x58)) {
            __base = 0x10;
            goto LAB_002ca44b;
          }
          break;
        }
        bVar1 = *pbVar5;
      }
      __base = 10;
LAB_002ca44b:
      local_38 = __nptr;
      p_Var6 = (_Base_ptr)
               strtoll_l((char *)__nptr,(char **)&local_38,__base,ClassicLocale::instance_);
      cVar4._M_node = p_Var6;
      if ((local_38 != __nptr) && (*local_38 == 0)) {
        if ((_Base_ptr)0xfffe < p_Var6) {
          cVar4._M_node = (_Base_ptr)0xffff;
        }
        local_3a = (unsigned_short)cVar4._M_node;
        if (p_Var6 < (_Base_ptr)0x10000) {
          __position._M_current =
               (__return_storage_ptr__->
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_short,std::allocator<unsigned_short>>::
            _M_realloc_insert<unsigned_short_const&>
                      ((vector<unsigned_short,std::allocator<unsigned_short>> *)
                       __return_storage_ptr__,__position,&local_3a);
            cVar4._M_node = extraout_RAX;
          }
          else {
            *__position._M_current = local_3a;
            (__return_storage_ptr__->
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
      }
    }
    ppFVar7 = ppFVar7 + 1;
  } while( true );
}

Assistant:

static std::vector<voffset_t> ExtractProtobufIds(
    const std::vector<FieldDef *> &fields) {
  static const std::string ID = "id";
  std::vector<voffset_t> used_proto_ids;
  for (const auto *field : fields) {
    const auto *id_attribute = field->attributes.Lookup(ID);
    if (id_attribute != nullptr && !id_attribute->constant.empty()) {
      voffset_t proto_id = 0;
      bool done = StringToNumber(id_attribute->constant.c_str(), &proto_id);
      if (done) { used_proto_ids.push_back(proto_id); }
    }
  }

  return used_proto_ids;
}